

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O2

void __thiscall
pbrt::FormattingScene::AreaLightSource
          (FormattingScene *this,string *name,ParsedParameterVector params,FileLoc loc)

{
  bool bVar1;
  FileLoc *loc_00;
  ostream *poVar2;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDX;
  Float FVar3;
  allocator<char> local_135;
  Float totalScale;
  string local_130;
  float local_10c;
  string extra;
  ParameterDictionary dict;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  local_80;
  
  extra._M_dataplus._M_p = (pointer)pstd::pmr::new_delete_resource();
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(&local_80,in_RDX,(polymorphic_allocator<pbrt::ParsedParameter_*> *)&extra);
  ParameterDictionary::ParameterDictionary(&dict,&local_80,RGBColorSpace::sRGB);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&local_80);
  extra._M_dataplus._M_p = (pointer)&extra.field_2;
  totalScale = 1.0;
  extra._M_string_length = 0;
  extra.field_2._M_local_buf[0] = '\0';
  if (this->upgrade == true) {
    bVar1 = upgradeRGBToScale(&dict,"scale",&totalScale);
    if (!bVar1) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"scale",&local_135);
      loc_00 = ParameterDictionary::loc(&dict,&local_130);
      (this->super_SceneRepresentation).errorExit = true;
      Error(loc_00,
            "In pbrt-v4, \"scale\" is a \"float\" parameter to light sources. Please modify your scene file manually."
           );
      goto LAB_004e2f2b;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"L",&local_135);
    FVar3 = ParameterDictionary::UpgradeBlackbody(&dict,&local_130);
    totalScale = FVar3 * totalScale;
    local_10c = totalScale;
    std::__cxx11::string::~string((string *)&local_130);
    bVar1 = std::operator==(name,"area");
    if (bVar1) {
      indent_abi_cxx11_(&local_130,this,0);
      Printf<std::__cxx11::string>("%sAreaLightSource \"diffuse\"\n",&local_130);
    }
    else {
      indent_abi_cxx11_(&local_130,this,0);
      Printf<std::__cxx11::string,std::__cxx11::string_const&>
                ("%sAreaLightSource \"%s\"\n",&local_130,name);
    }
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"nsamples",&local_135);
    ParameterDictionary::RemoveInt(&dict,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    if ((local_10c != 1.0) || (NAN(local_10c))) {
      indent_abi_cxx11_(&local_130,this,1);
      Printf<std::__cxx11::string,float&>("%s\"float scale\" [%f]\n",&local_130,&totalScale);
      goto LAB_004e2eee;
    }
  }
  else {
    indent_abi_cxx11_(&local_130,this,0);
    Printf<std::__cxx11::string,std::__cxx11::string_const&>
              ("%sAreaLightSource \"%s\"\n",&local_130,name);
LAB_004e2eee:
    std::__cxx11::string::~string((string *)&local_130);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)&extra);
  ParameterDictionary::ToParameterList_abi_cxx11_
            (&local_130,&dict,*(int *)&(this->super_SceneRepresentation).field_0xc);
  std::operator<<(poVar2,(string *)&local_130);
LAB_004e2f2b:
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&extra);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&dict.params);
  return;
}

Assistant:

void FormattingScene::AreaLightSource(const std::string &name,
                                      ParsedParameterVector params, FileLoc loc) {
    ParameterDictionary dict(params, RGBColorSpace::sRGB);
    std::string extra;
    Float totalScale = 1;
    if (upgrade) {
        if (!upgradeRGBToScale(&dict, "scale", &totalScale)) {
            ErrorExitDeferred(dict.loc("scale"),
                              "In pbrt-v4, \"scale\" is a \"float\" parameter "
                              "to light sources. "
                              "Please modify your scene file manually.");
            return;
        }

        totalScale *= dict.UpgradeBlackbody("L");

        if (name == "area")
            Printf("%sAreaLightSource \"diffuse\"\n", indent());
        else
            Printf("%sAreaLightSource \"%s\"\n", indent(), name);
        dict.RemoveInt("nsamples");
    } else
        Printf("%sAreaLightSource \"%s\"\n", indent(), name);

    if (totalScale != 1)
        Printf("%s\"float scale\" [%f]\n", indent(1), totalScale);
    std::cout << extra << dict.ToParameterList(catIndentCount);
}